

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

pool_ptr<soul::AST::Statement> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::Statement>
          (RewritingASTVisitor *this,pool_ptr<soul::AST::Statement> *o)

{
  Statement *pSVar1;
  pool_ptr<soul::AST::Statement> *in_RDX;
  
  if (in_RDX->object == (Statement *)0x0) {
    pSVar1 = (Statement *)0x0;
  }
  else {
    pSVar1 = pool_ptr<soul::AST::Statement>::operator*(in_RDX);
    pSVar1 = visitObject((RewritingASTVisitor *)o,pSVar1);
  }
  this->_vptr_RewritingASTVisitor = (_func_int **)pSVar1;
  return (pool_ptr<soul::AST::Statement>)(Statement *)this;
}

Assistant:

pool_ptr<Type> visitAs (pool_ptr<Type> o)
    {
        if (o == nullptr)
            return {};

        SOUL_ASSERT (is_type<Type> (o));
        return static_cast<Type&> (visitObject (*o));
    }